

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

ostream * CMU462::operator<<(ostream *os,Matrix4x4 *A)

{
  ostream *poVar1;
  int i;
  long lVar2;
  long lVar3;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    std::operator<<(os,"[ ");
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)A + lVar3));
      std::operator<<(poVar1," ");
    }
    poVar1 = std::operator<<(os,"]");
    std::endl<char,std::char_traits<char>>(poVar1);
    A = (Matrix4x4 *)((long)A + 8);
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Matrix4x4& A ) {
    for( int i = 0; i < 4; i++ )
    {
       os << "[ ";

       for( int j = 0; j < 4; j++ )
       {
          os << A(i,j) << " ";
       }

       os << "]" << std::endl;
    }

    return os;
  }